

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegratorCreator.hpp
# Opt level: O0

void __thiscall OpenMD::IntegratorCreator::~IntegratorCreator(IntegratorCreator *this)

{
  code *pcVar1;
  IntegratorCreator *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~IntegratorCreator() = default;